

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O0

void __thiscall camp::UserObject::UserObject(UserObject *this,UserObject *copy)

{
  bool bVar1;
  ParentObject *pPVar2;
  ParentObject *pPVar3;
  ParentObject *local_68;
  UserObject *copy_local;
  UserObject *this_local;
  
  this->m_class = copy->m_class;
  std::shared_ptr<camp::detail::AbstractObjectHolder>::shared_ptr(&this->m_holder,&copy->m_holder);
  bVar1 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&copy->m_parent);
  if (bVar1) {
    local_68 = (ParentObject *)operator_new(0x58);
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(&copy->m_parent);
    pPVar2 = boost::scoped_ptr<camp::ParentObject>::operator->(&copy->m_parent);
    ParentObject::ParentObject(local_68,&pPVar3->object,pPVar2->member);
  }
  else {
    local_68 = (ParentObject *)0x0;
  }
  boost::scoped_ptr<camp::ParentObject>::scoped_ptr(&this->m_parent,local_68);
  bVar1 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&this->m_parent);
  if (bVar1) {
    pPVar3 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
    (pPVar3->object).m_child = this;
  }
  return;
}

Assistant:

UserObject::UserObject(const UserObject& copy)
    : m_class(copy.m_class)
    , m_holder(copy.m_holder)
    , m_parent(copy.m_parent ? new ParentObject(copy.m_parent->object, copy.m_parent->member) : 0)
{
    if (m_parent)
        m_parent->object.m_child = this;
}